

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O1

void amrex::EB_interp_CellCentroid_to_FaceCentroid
               (MultiFab *phi_centroid,MultiFab *phi_xface,MultiFab *phi_yface,MultiFab *phi_zface,
               int scomp,int dcomp,int ncomp,Geometry *a_geom,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *a_bcs)

{
  int iVar1;
  int iVar2;
  pointer pBVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  double *pdVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  double *pdVar18;
  Long LVar19;
  Long LVar20;
  Long LVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  FabType FVar24;
  FabType FVar25;
  long lVar26;
  int *piVar27;
  int *piVar28;
  Periodicity PVar29;
  Box txbx;
  Box txbx_1;
  Box result;
  MFIter mfi;
  MFItInfo mfi_info;
  Array4<const_double> local_658;
  FabArray<amrex::FArrayBox> *local_618;
  FabArray<amrex::EBCellFlagFab> *local_610;
  double *local_608 [5];
  undefined8 *local_5e0;
  undefined8 *local_5d8;
  undefined8 *local_5d0;
  MultiCutFab *local_5c8;
  FabArray<amrex::FArrayBox> *local_5c0;
  undefined1 local_5b8 [32];
  Long local_598;
  undefined8 uStack_584;
  Array4<const_double> local_578;
  Array4<const_double> local_538;
  double *local_4f8 [3];
  double *local_4dc [3];
  double *local_4c0 [3];
  Box local_4a4;
  MultiCutFab *local_488;
  MultiCutFab *local_480;
  MultiCutFab *local_478;
  MultiCutFab *local_470;
  MultiCutFab *local_468;
  MultiCutFab *local_460;
  undefined1 local_458 [28];
  undefined4 uStack_43c;
  Long LStack_438;
  int iStack_430;
  int local_42c;
  int iStack_428;
  int iStack_424;
  int iStack_420;
  int iStack_41c;
  int local_418;
  int iStack_414;
  int iStack_410;
  int iStack_40c;
  int local_408;
  undefined4 uStack_404;
  double *pdStack_400;
  Long LStack_3f8;
  int iStack_3f0;
  int local_3ec;
  int iStack_3e8;
  int iStack_3e4;
  int iStack_3e0;
  int iStack_3dc;
  int local_3d8;
  int iStack_3d4;
  int iStack_3d0;
  int iStack_3cc;
  int iStack_3c8;
  int iStack_3c4;
  double *local_3c0;
  int iStack_3b8;
  Long local_3b0;
  Long LStack_3a8;
  Dim3 aDStack_3a0 [2];
  int iStack_388;
  double *local_380;
  int local_378;
  undefined8 local_370 [8];
  undefined8 local_330 [8];
  undefined8 local_2f0 [9];
  Array4<double> local_2a8;
  Array4<double> local_268;
  Array4<double> local_228;
  MFIter local_1e8;
  Array4<const_double> local_188;
  Array4<const_double> local_148;
  Array4<const_double> local_108;
  Array4<const_double> local_c8;
  Array4<const_double> local_88;
  MFItInfo local_44;
  
  local_618 = &phi_centroid->super_FabArray<amrex::FArrayBox>;
  lVar26 = __dynamic_cast((phi_centroid->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                          super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                          _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                          &EBFArrayBoxFactory::typeinfo,0);
  if (lVar26 == 0) {
    __cxa_bad_cast();
  }
  local_610 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar26 + 0xd8));
  local_5c0 = &EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar26 + 0xd8))->
               super_FabArray<amrex::FArrayBox>;
  EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar26 + 0xd8));
  EBDataCollection::getFaceCent(*(EBDataCollection **)(lVar26 + 0xd8));
  local_5c8 = EBDataCollection::getCentroid(*(EBDataCollection **)(lVar26 + 0xd8));
  if (((long)(a_bcs->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
             super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(a_bcs->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
             super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 < (long)ncomp) {
    Assert_host("a_bcs.size() >= ncomp",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EBMultiFabUtil.cpp"
                ,0x426,(char *)0x0);
  }
  uVar5 = *(undefined8 *)(a_geom->domain).smallend.vect;
  iVar1 = (a_geom->domain).smallend.vect[2];
  pdVar6 = *(double **)(a_geom->domain).bigend.vect;
  iVar2 = (a_geom->domain).bigend.vect[2];
  local_458._0_4_ = 0;
  local_458._4_4_ = 0;
  local_458._8_4_ = 0;
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&phi_xface->super_FabArray<amrex::FArrayBox>,1e+40,dcomp,ncomp,(IntVect *)local_458);
  local_458._0_4_ = 0;
  local_458._4_4_ = 0;
  local_458._8_4_ = 0;
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&phi_yface->super_FabArray<amrex::FArrayBox>,1e+40,dcomp,ncomp,(IntVect *)local_458);
  local_458._0_4_ = 0;
  local_458._4_4_ = 0;
  local_458._8_4_ = 0;
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&phi_zface->super_FabArray<amrex::FArrayBox>,1e+40,dcomp,ncomp,(IntVect *)local_458);
  pBVar3 = (a_bcs->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
           super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_44.do_tiling = false;
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.tilesize.vect[0] = 0;
  local_44.tilesize.vect[1] = 0;
  local_44.tilesize.vect[2] = 0;
  local_44.dynamic = true;
  local_44.device_sync = true;
  MFIter::MFIter(&local_1e8,&local_618->super_FabArrayBase,&local_44);
  if (local_1e8.currentIndex < local_1e8.endIndex) {
    local_5d0 = local_370;
    local_5d8 = local_330;
    local_5e0 = local_2f0;
    do {
      piVar28 = &local_1e8.currentIndex;
      MFIter::tilebox(&local_4a4,&local_1e8);
      MFIter::nodaltilebox((Box *)local_4c0,&local_1e8,0);
      MFIter::nodaltilebox((Box *)local_4dc,&local_1e8,1);
      MFIter::nodaltilebox((Box *)local_4f8,&local_1e8,2);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_658,local_618,&local_1e8,scomp);
      piVar27 = piVar28;
      if (local_1e8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar27 = ((local_1e8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + local_1e8.currentIndex;
      }
      local_458._20_4_ = local_4a4.bigend.vect[2];
      local_458._24_4_ = local_4a4.btype.itype;
      local_458._0_4_ = local_4a4.smallend.vect[0];
      local_458._4_4_ = local_4a4.smallend.vect[1];
      FVar24 = EBCellFlagFab::getType
                         ((local_610->m_fabs_v).
                          super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[*piVar27],(Box *)local_458);
      if (local_1e8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar28 = ((local_1e8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + local_1e8.currentIndex;
      }
      local_458._20_4_ = local_4a4.bigend.vect[2];
      local_458._24_4_ = local_4a4.btype.itype;
      local_458._0_4_ = local_4a4.smallend.vect[0];
      local_458._4_4_ = local_4a4.smallend.vect[1];
      local_458._0_4_ = local_458._0_4_ + -4;
      local_458._4_4_ = local_458._4_4_ + -4;
      local_458._8_4_ = local_4a4.smallend.vect[2] + -4;
      local_458._12_4_ = local_4a4.bigend.vect[0] + 4;
      local_458._16_4_ = local_4a4.bigend.vect[1] + 4;
      local_458._20_4_ = local_458._20_4_ + 4;
      FVar25 = EBCellFlagFab::getType
                         ((local_610->m_fabs_v).
                          super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[*piVar28],(Box *)local_458);
      if (FVar24 != covered) {
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_228,&phi_xface->super_FabArray<amrex::FArrayBox>,&local_1e8,dcomp);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_268,&phi_yface->super_FabArray<amrex::FArrayBox>,&local_1e8,dcomp);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_2a8,&phi_zface->super_FabArray<amrex::FArrayBox>,&local_1e8,dcomp);
        iVar16 = iStack_3c4;
        iVar14 = iStack_3c8;
        iVar12 = iStack_3d4;
        iVar10 = local_3d8;
        local_3d8 = (int)uVar5;
        iVar11 = local_3d8;
        iStack_3d4 = (int)((ulong)uVar5 >> 0x20);
        iVar13 = iStack_3d4;
        iStack_3c8 = (int)pBVar3;
        iVar15 = iStack_3c8;
        iStack_3c4 = (int)((ulong)pBVar3 >> 0x20);
        iVar17 = iStack_3c4;
        if (FVar25 == regular) {
          local_5b8._20_4_ = (undefined4)stack0xfffffffffffffb54;
          local_5b8._24_4_ = SUB84(stack0xfffffffffffffb54,4);
          local_5b8._0_8_ = local_4c0[0];
          iStack_40c = local_228.end.z;
          local_408 = local_228.ncomp;
          iStack_420 = local_228.begin.x;
          iStack_41c = local_228.begin.y;
          iStack_430 = (int)local_228.kstride;
          local_42c = (int)((ulong)local_228.kstride >> 0x20);
          iStack_428 = (int)local_228.nstride;
          iStack_424 = (int)((ulong)local_228.nstride >> 0x20);
          local_458._24_4_ = SUB84(local_228.p,0);
          uStack_43c = (undefined4)((ulong)local_228.p >> 0x20);
          LStack_438 = local_228.jstride;
          iStack_3cc = local_658.end.z;
          iStack_3c8 = local_658.ncomp;
          iStack_3e0 = local_658.begin.x;
          iStack_3dc = local_658.begin.y;
          iStack_3f0 = (int)local_658.kstride;
          local_3ec = (int)((ulong)local_658.kstride >> 0x20);
          iStack_3e8 = (int)local_658.nstride;
          iStack_3e4 = (int)((ulong)local_658.nstride >> 0x20);
          pdStack_400 = local_658.p;
          LStack_3f8 = local_658.jstride;
          local_458._0_4_ = local_3d8;
          local_458._4_4_ = iStack_3d4;
          local_458._8_4_ = iVar1;
          local_458._16_4_ = iVar15;
          local_458._20_4_ = iStack_3c4;
          iStack_3c4 = iVar16;
          local_3c0 = pdVar6;
          iStack_3b8 = iVar2;
          Loop<amrex::eb_interp_cc2face_x(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                    ((Box *)local_5b8,ncomp,(anon_class_168_5_9f62599b *)local_458);
          local_5b8._20_4_ = (undefined4)stack0xfffffffffffffb38;
          local_5b8._24_4_ = SUB84(stack0xfffffffffffffb38,4);
          local_5b8._0_8_ = local_4dc[0];
          iStack_40c = local_268.end.z;
          local_408 = local_268.ncomp;
          iStack_420 = local_268.begin.x;
          iStack_41c = local_268.begin.y;
          iStack_430 = (int)local_268.kstride;
          local_42c = (int)((ulong)local_268.kstride >> 0x20);
          iStack_428 = (int)local_268.nstride;
          iStack_424 = (int)((ulong)local_268.nstride >> 0x20);
          local_458._24_4_ = SUB84(local_268.p,0);
          uStack_43c = (undefined4)((ulong)local_268.p >> 0x20);
          LStack_438 = local_268.jstride;
          iStack_3cc = local_658.end.z;
          iStack_3c8 = local_658.ncomp;
          iStack_3e0 = local_658.begin.x;
          iStack_3dc = local_658.begin.y;
          iStack_3f0 = (int)local_658.kstride;
          local_3ec = (int)((ulong)local_658.kstride >> 0x20);
          iStack_3e8 = (int)local_658.nstride;
          iStack_3e4 = (int)((ulong)local_658.nstride >> 0x20);
          pdStack_400 = local_658.p;
          LStack_3f8 = local_658.jstride;
          local_458._0_4_ = local_3d8;
          local_458._4_4_ = iStack_3d4;
          local_458._8_4_ = iVar1;
          local_458._16_4_ = iVar15;
          local_458._20_4_ = iVar17;
          local_3c0 = pdVar6;
          iStack_3b8 = iVar2;
          Loop<amrex::eb_interp_cc2face_y(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                    ((Box *)local_5b8,ncomp,(anon_class_168_5_9f625d5c *)local_458);
          local_5b8._20_4_ = (undefined4)stack0xfffffffffffffb1c;
          local_5b8._24_4_ = SUB84(stack0xfffffffffffffb1c,4);
          local_5b8._0_8_ = local_4f8[0];
          iStack_410 = local_2a8.end.y;
          iStack_40c = local_2a8.end.z;
          local_408 = local_2a8.ncomp;
          iStack_420 = local_2a8.begin.x;
          iStack_41c = local_2a8.begin.y;
          local_418 = local_2a8.begin.z;
          iStack_414 = local_2a8.end.x;
          iStack_430 = (int)local_2a8.kstride;
          local_42c = (int)((ulong)local_2a8.kstride >> 0x20);
          iStack_428 = (int)local_2a8.nstride;
          iStack_424 = (int)((ulong)local_2a8.nstride >> 0x20);
          local_458._24_4_ = SUB84(local_2a8.p,0);
          uStack_43c = (undefined4)((ulong)local_2a8.p >> 0x20);
          LStack_438 = local_2a8.jstride;
          iStack_3d0 = local_658.end.y;
          iStack_3cc = local_658.end.z;
          iStack_3c8 = local_658.ncomp;
          iStack_3e0 = local_658.begin.x;
          iStack_3dc = local_658.begin.y;
          local_3d8 = local_658.begin.z;
          iStack_3d4 = local_658.end.x;
          iStack_3f0 = (int)local_658.kstride;
          local_3ec = (int)((ulong)local_658.kstride >> 0x20);
          iStack_3e8 = (int)local_658.nstride;
          iStack_3e4 = (int)((ulong)local_658.nstride >> 0x20);
          pdStack_400 = local_658.p;
          LStack_3f8 = local_658.jstride;
          local_458._0_4_ = iVar11;
          local_458._4_4_ = iVar13;
          local_458._8_4_ = iVar1;
          local_458._16_4_ = iVar15;
          local_458._20_4_ = iVar17;
          local_3c0 = pdVar6;
          iStack_3b8 = iVar2;
          Loop<amrex::eb_interp_cc2face_z(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                    ((Box *)local_5b8,ncomp,(anon_class_168_5_9f62611d *)local_458);
        }
        else {
          local_3d8 = iVar10;
          iStack_3d4 = iVar12;
          iStack_3c8 = iVar14;
          iStack_3c4 = iVar16;
          MultiCutFab::const_array((Array4<const_double> *)local_5b8,local_470,&local_1e8);
          MultiCutFab::const_array(&local_88,local_468,&local_1e8);
          MultiCutFab::const_array(&local_c8,local_460,&local_1e8);
          MultiCutFab::const_array(&local_108,local_488,&local_1e8);
          MultiCutFab::const_array(&local_148,local_480,&local_1e8);
          MultiCutFab::const_array(&local_188,local_478,&local_1e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_538,local_5c0,&local_1e8);
          MultiCutFab::const_array(&local_578,local_5c8,&local_1e8);
          puVar9 = local_5d0;
          puVar8 = local_5d8;
          puVar7 = local_5e0;
          local_608._20_8_ = stack0xfffffffffffffb54;
          local_608[0] = local_4c0[0];
          iStack_424 = (int)uStack_584;
          iStack_420 = SUB84(uStack_584,4);
          LStack_438 = local_598;
          local_458._20_4_ = local_5b8._20_4_;
          local_458._24_4_ = local_5b8._24_4_;
          local_458._0_4_ = (undefined4)local_5b8._0_8_;
          local_458._4_4_ = SUB84(local_5b8._0_8_,4);
          iStack_3e4 = local_228.end.z;
          iStack_3e0 = local_228.ncomp;
          LStack_3f8._0_4_ = local_228.begin.x;
          LStack_3f8._4_4_ = local_228.begin.y;
          local_408 = (int)local_228.kstride;
          uStack_404 = (undefined4)((ulong)local_228.kstride >> 0x20);
          pdStack_400 = (double *)local_228.nstride;
          local_418 = (int)local_228.p;
          iStack_414 = (int)((ulong)local_228.p >> 0x20);
          iStack_410 = (int)local_228.jstride;
          iStack_40c = (int)((ulong)local_228.jstride >> 0x20);
          aDStack_3a0[1].z = local_658.end.z;
          iStack_388 = local_658.ncomp;
          aDStack_3a0[0].x = local_658.begin.x;
          aDStack_3a0[0].y = local_658.begin.y;
          local_3b0 = local_658.kstride;
          LStack_3a8 = local_658.nstride;
          iStack_3b8 = (int)local_658.jstride;
          *(ulong *)((long)local_5d0 + 0x2c) = CONCAT44(local_538.end.y,local_538.end.x);
          *(undefined8 *)((long)local_5d0 + 0x34) = local_538._52_8_;
          local_5d0[4] = local_538.begin._0_8_;
          local_5d0[5] = CONCAT44(local_538.end.x,local_538.begin.z);
          local_5d0[2] = local_538.kstride;
          local_5d0[3] = local_538.nstride;
          *local_5d0 = local_538.p;
          local_5d0[1] = local_538.jstride;
          *(ulong *)((long)local_5d8 + 0x2c) = CONCAT44(local_578.end.y,local_578.end.x);
          *(undefined8 *)((long)local_5d8 + 0x34) = local_578._52_8_;
          local_5d8[4] = local_578.begin._0_8_;
          local_5d8[5] = CONCAT44(local_578.end.x,local_578.begin.z);
          local_5d8[2] = local_578.kstride;
          local_5d8[3] = local_578.nstride;
          *local_5d8 = local_578.p;
          local_5d8[1] = local_578.jstride;
          uVar23 = local_108._52_8_;
          uVar22 = local_108.begin._0_8_;
          LVar21 = local_108.nstride;
          LVar20 = local_108.kstride;
          LVar19 = local_108.jstride;
          pdVar18 = local_108.p;
          uVar4 = CONCAT44(local_108.end.x,local_108.begin.z);
          *(ulong *)((long)local_5e0 + 0x2c) = CONCAT44(local_108.end.y,local_108.end.x);
          *(undefined8 *)((long)local_5e0 + 0x34) = uVar23;
          local_5e0[4] = uVar22;
          local_5e0[5] = uVar4;
          local_5e0[2] = LVar20;
          local_5e0[3] = LVar21;
          *local_5e0 = pdVar18;
          local_5e0[1] = LVar19;
          local_3d8 = iVar11;
          iStack_3d4 = iVar13;
          iStack_3d0 = iVar1;
          iStack_3c8 = iVar15;
          iStack_3c4 = iVar17;
          local_380 = pdVar6;
          local_378 = iVar2;
          Loop<amrex::eb_interp_centroid2facecent_x(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                    ((Box *)local_608,ncomp,(anon_class_424_9_c4b22738 *)local_458);
          local_608._20_8_ = stack0xfffffffffffffb38;
          local_608[0] = local_4dc[0];
          iStack_424 = local_88.end.z;
          iStack_420 = local_88.ncomp;
          LStack_438._0_4_ = local_88.begin.x;
          LStack_438._4_4_ = local_88.begin.y;
          local_458._16_4_ = (undefined4)local_88.kstride;
          local_458._20_4_ = (undefined4)((ulong)local_88.kstride >> 0x20);
          local_458._24_4_ = (undefined4)local_88.nstride;
          uStack_43c = (undefined4)((ulong)local_88.nstride >> 0x20);
          local_458._0_4_ = SUB84(local_88.p,0);
          local_458._4_4_ = (undefined4)((ulong)local_88.p >> 0x20);
          local_458._8_4_ = (undefined4)local_88.jstride;
          local_458._12_4_ = (undefined4)((ulong)local_88.jstride >> 0x20);
          iStack_3e4 = local_268.end.z;
          iStack_3e0 = local_268.ncomp;
          LStack_3f8._0_4_ = local_268.begin.x;
          LStack_3f8._4_4_ = local_268.begin.y;
          local_408 = (int)local_268.kstride;
          uStack_404 = (undefined4)((ulong)local_268.kstride >> 0x20);
          pdStack_400 = (double *)local_268.nstride;
          local_418 = (int)local_268.p;
          iStack_414 = (int)((ulong)local_268.p >> 0x20);
          iStack_410 = (int)local_268.jstride;
          iStack_40c = (int)((ulong)local_268.jstride >> 0x20);
          aDStack_3a0[1].z = local_658.end.z;
          iStack_388 = local_658.ncomp;
          aDStack_3a0[0].x = local_658.begin.x;
          aDStack_3a0[0].y = local_658.begin.y;
          local_3b0 = local_658.kstride;
          LStack_3a8 = local_658.nstride;
          iStack_3b8 = (int)local_658.jstride;
          *(ulong *)((long)puVar9 + 0x2c) = CONCAT44(local_538.end.y,local_538.end.x);
          *(undefined8 *)((long)puVar9 + 0x34) = local_538._52_8_;
          puVar9[4] = local_538.begin._0_8_;
          puVar9[5] = CONCAT44(local_538.end.x,local_538.begin.z);
          puVar9[2] = local_538.kstride;
          puVar9[3] = local_538.nstride;
          *puVar9 = local_538.p;
          puVar9[1] = local_538.jstride;
          *(ulong *)((long)puVar8 + 0x2c) = CONCAT44(local_578.end.y,local_578.end.x);
          *(undefined8 *)((long)puVar8 + 0x34) = local_578._52_8_;
          puVar8[4] = local_578.begin._0_8_;
          puVar8[5] = CONCAT44(local_578.end.x,local_578.begin.z);
          puVar8[2] = local_578.kstride;
          puVar8[3] = local_578.nstride;
          *puVar8 = local_578.p;
          puVar8[1] = local_578.jstride;
          uVar23 = local_148._52_8_;
          uVar22 = local_148.begin._0_8_;
          LVar21 = local_148.nstride;
          LVar20 = local_148.kstride;
          LVar19 = local_148.jstride;
          pdVar18 = local_148.p;
          uVar4 = CONCAT44(local_148.end.x,local_148.begin.z);
          *(ulong *)((long)puVar7 + 0x2c) = CONCAT44(local_148.end.y,local_148.end.x);
          *(undefined8 *)((long)puVar7 + 0x34) = uVar23;
          puVar7[4] = uVar22;
          puVar7[5] = uVar4;
          puVar7[2] = LVar20;
          puVar7[3] = LVar21;
          *puVar7 = pdVar18;
          puVar7[1] = LVar19;
          local_3d8 = iVar11;
          iStack_3d4 = iVar13;
          iStack_3d0 = iVar1;
          iStack_3c8 = iVar15;
          iStack_3c4 = iVar17;
          local_380 = pdVar6;
          local_378 = iVar2;
          Loop<amrex::eb_interp_centroid2facecent_y(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                    ((Box *)local_608,ncomp,(anon_class_424_9_c0d7c319 *)local_458);
          local_608._20_8_ = stack0xfffffffffffffb1c;
          local_608[0] = local_4f8[0];
          iStack_428 = local_c8.end.y;
          iStack_424 = local_c8.end.z;
          iStack_420 = local_c8.ncomp;
          LStack_438._0_4_ = local_c8.begin.x;
          LStack_438._4_4_ = local_c8.begin.y;
          iStack_430 = local_c8.begin.z;
          local_42c = local_c8.end.x;
          local_458._16_4_ = (undefined4)local_c8.kstride;
          local_458._20_4_ = (undefined4)((ulong)local_c8.kstride >> 0x20);
          local_458._24_4_ = (undefined4)local_c8.nstride;
          uStack_43c = (undefined4)((ulong)local_c8.nstride >> 0x20);
          local_458._0_4_ = SUB84(local_c8.p,0);
          local_458._4_4_ = (undefined4)((ulong)local_c8.p >> 0x20);
          local_458._8_4_ = (undefined4)local_c8.jstride;
          local_458._12_4_ = (undefined4)((ulong)local_c8.jstride >> 0x20);
          iStack_3e8 = local_2a8.end.y;
          iStack_3e4 = local_2a8.end.z;
          iStack_3e0 = local_2a8.ncomp;
          LStack_3f8._0_4_ = local_2a8.begin.x;
          LStack_3f8._4_4_ = local_2a8.begin.y;
          iStack_3f0 = local_2a8.begin.z;
          local_3ec = local_2a8.end.x;
          local_408 = (int)local_2a8.kstride;
          uStack_404 = (undefined4)((ulong)local_2a8.kstride >> 0x20);
          pdStack_400 = (double *)local_2a8.nstride;
          local_418 = (int)local_2a8.p;
          iStack_414 = (int)((ulong)local_2a8.p >> 0x20);
          iStack_410 = (int)local_2a8.jstride;
          iStack_40c = (int)((ulong)local_2a8.jstride >> 0x20);
          aDStack_3a0[1].z = local_658.end.z;
          iStack_388 = local_658.ncomp;
          aDStack_3a0[0].x = local_658.begin.x;
          aDStack_3a0[0].y = local_658.begin.y;
          local_3b0 = local_658.kstride;
          LStack_3a8 = local_658.nstride;
          local_3c0 = local_658.p;
          iStack_3b8 = (int)local_658.jstride;
          *(ulong *)((long)puVar9 + 0x2c) = CONCAT44(local_538.end.y,local_538.end.x);
          *(undefined8 *)((long)puVar9 + 0x34) = local_538._52_8_;
          puVar9[4] = local_538.begin._0_8_;
          puVar9[5] = CONCAT44(local_538.end.x,local_538.begin.z);
          puVar9[2] = local_538.kstride;
          puVar9[3] = local_538.nstride;
          *puVar9 = local_538.p;
          puVar9[1] = local_538.jstride;
          *(ulong *)((long)puVar8 + 0x2c) = CONCAT44(local_578.end.y,local_578.end.x);
          *(undefined8 *)((long)puVar8 + 0x34) = local_578._52_8_;
          puVar8[4] = local_578.begin._0_8_;
          puVar8[5] = CONCAT44(local_578.end.x,local_578.begin.z);
          puVar8[2] = local_578.kstride;
          puVar8[3] = local_578.nstride;
          *puVar8 = local_578.p;
          puVar8[1] = local_578.jstride;
          uVar23 = local_188._52_8_;
          uVar22 = local_188.begin._0_8_;
          LVar21 = local_188.nstride;
          LVar20 = local_188.kstride;
          LVar19 = local_188.jstride;
          pdVar18 = local_188.p;
          uVar4 = CONCAT44(local_188.end.x,local_188.begin.z);
          *(ulong *)((long)puVar7 + 0x2c) = CONCAT44(local_188.end.y,local_188.end.x);
          *(undefined8 *)((long)puVar7 + 0x34) = uVar23;
          puVar7[4] = uVar22;
          puVar7[5] = uVar4;
          puVar7[2] = LVar20;
          puVar7[3] = LVar21;
          *puVar7 = pdVar18;
          puVar7[1] = LVar19;
          local_3d8 = iVar11;
          iStack_3d4 = iVar13;
          iStack_3d0 = iVar1;
          iStack_3c8 = iVar15;
          iStack_3c4 = iVar17;
          local_380 = pdVar6;
          local_378 = iVar2;
          Loop<amrex::eb_interp_centroid2facecent_z(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                    ((Box *)local_608,ncomp,(anon_class_424_9_bcfd5efa *)local_458);
        }
      }
      MFIter::operator++(&local_1e8);
    } while (local_1e8.currentIndex < local_1e8.endIndex);
  }
  MFIter::~MFIter(&local_1e8);
  PVar29 = Geometry::periodicity(a_geom);
  local_458._0_4_ = PVar29.period.vect[0];
  local_458._4_4_ = PVar29.period.vect[1];
  local_458._8_4_ = PVar29.period.vect[2];
  FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&phi_xface->super_FabArray<amrex::FArrayBox>,(Periodicity *)local_458,false);
  PVar29 = Geometry::periodicity(a_geom);
  local_458._0_4_ = PVar29.period.vect[0];
  local_458._4_4_ = PVar29.period.vect[1];
  local_458._8_4_ = PVar29.period.vect[2];
  FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&phi_yface->super_FabArray<amrex::FArrayBox>,(Periodicity *)local_458,false);
  PVar29 = Geometry::periodicity(a_geom);
  local_458._0_4_ = PVar29.period.vect[0];
  local_458._4_4_ = PVar29.period.vect[1];
  local_458._8_4_ = PVar29.period.vect[2];
  FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&phi_zface->super_FabArray<amrex::FArrayBox>,(Periodicity *)local_458,false);
  return;
}

Assistant:

void
EB_interp_CellCentroid_to_FaceCentroid (const MultiFab& phi_centroid,
                                        AMREX_D_DECL( MultiFab& phi_xface,
                                                      MultiFab& phi_yface,
                                                      MultiFab& phi_zface),
                                        int scomp, int dcomp, int ncomp,
                                        const Geometry& a_geom,
                                        const Vector<BCRec>& a_bcs)
{
    const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>(phi_centroid.Factory());
    const auto& flags = factory.getMultiEBCellFlagFab();
    const auto& vfrac = factory.getVolFrac();
    const auto& area  = factory.getAreaFrac();
    const auto& fcent = factory.getFaceCent();
    const auto& ccent = factory.getCentroid();

    // We assume that we start from the first component of bcs ... we may need to generalize this
    AMREX_ALWAYS_ASSERT(a_bcs.size() >= ncomp );

    Box domain(a_geom.Domain());

    const int nghost(4);

   // Initialize edge state
    AMREX_D_TERM(phi_xface.setVal(1e40,dcomp,ncomp);,
                 phi_yface.setVal(1e40,dcomp,ncomp);,
                 phi_zface.setVal(1e40,dcomp,ncomp));

    BCRec const* d_bcs;
#ifdef AMREX_USE_GPU
    Gpu::DeviceVector<BCRec> dv_bcs(ncomp);
    if (Gpu::inLaunchRegion())
    {
        Gpu::copy(Gpu::hostToDevice, a_bcs.begin(), a_bcs.begin()+ncomp, dv_bcs.begin());
        d_bcs = dv_bcs.dataPtr();
    }
    else
#endif
    {
        d_bcs = a_bcs.dataPtr();
    }

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(phi_centroid, mfi_info);  mfi.isValid(); ++mfi)
    {
        const Box& vbx = mfi.tilebox();
        AMREX_D_TERM(const Box& xbx = mfi.nodaltilebox(0);,
                     const Box& ybx = mfi.nodaltilebox(1);,
                     const Box& zbx = mfi.nodaltilebox(2));
        const auto& ccfab = phi_centroid.array(mfi,scomp);
        const auto fabtyp = flags[mfi].getType(amrex::grow(vbx,0));
        const auto fabtyp_ghost = flags[mfi].getType(amrex::grow(vbx,nghost));

        if (fabtyp != FabType::covered)
        {
            AMREX_D_TERM(Array4<Real> const& phi_x = phi_xface.array(mfi,dcomp);,
                         Array4<Real> const& phi_y = phi_yface.array(mfi,dcomp);,
                         Array4<Real> const& phi_z = phi_zface.array(mfi,dcomp));

            if (fabtyp_ghost == FabType::regular )
            {
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
                    (xbx, txbx,
                     {
                         eb_interp_cc2face_x(txbx, ccfab, phi_x, ncomp, domain, d_bcs);
                     },
                     ybx, tybx,
                     {
                         eb_interp_cc2face_y(tybx, ccfab, phi_y, ncomp, domain, d_bcs);
                     },
                     zbx, tzbx,
                     {
                         eb_interp_cc2face_z(tzbx, ccfab, phi_z, ncomp, domain, d_bcs);
                     });
            }
            else
            {
                AMREX_D_TERM(Array4<Real const> const& apxfab = area[0]->const_array(mfi);,
                             Array4<Real const> const& apyfab = area[1]->const_array(mfi);,
                             Array4<Real const> const& apzfab = area[2]->const_array(mfi));

                AMREX_D_TERM(Array4<Real const> const& fcx = fcent[0]->const_array(mfi);,
                             Array4<Real const> const& fcy = fcent[1]->const_array(mfi);,
                             Array4<Real const> const& fcz = fcent[2]->const_array(mfi));

                Array4<Real const> const& cvol = vfrac.const_array(mfi);
                Array4<Real const> const& cct  = ccent.const_array(mfi);

                AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
                    (xbx, txbx,
                     {
                         eb_interp_centroid2facecent_x(txbx, ccfab, apxfab, cvol, cct, fcx, phi_x,
                                                       ncomp, domain, d_bcs);
                     },
                     ybx, tybx,
                     {
                         eb_interp_centroid2facecent_y(tybx, ccfab, apyfab, cvol, cct, fcy, phi_y,
                                                       ncomp, domain, d_bcs);
                     },
                     zbx, tzbx,
                     {
                         eb_interp_centroid2facecent_z(tzbx, ccfab, apzfab, cvol, cct, fcz, phi_z,
                                                       ncomp, domain, d_bcs);
                     });
            }
        }
    }

    phi_xface.FillBoundary(a_geom.periodicity());
    phi_yface.FillBoundary(a_geom.periodicity());
#if ( AMREX_SPACEDIM == 3 )
    phi_zface.FillBoundary(a_geom.periodicity());
#endif

}